

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_attention.h
# Opt level: O0

void __thiscall
shift_window_transformer::WindowAttention<float>::~WindowAttention
          (WindowAttention<float> *this,void **vtt)

{
  Linear<float> *pLVar1;
  Tensor<float> *pTVar2;
  Tensor<int> *this_00;
  void **vtt_local;
  WindowAttention<float> *this_local;
  
  *(void **)this = *vtt;
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x28)) = vtt[1];
  if (this->qLinear != (Linear<float> *)0x0) {
    pLVar1 = this->qLinear;
    if (pLVar1 != (Linear<float> *)0x0) {
      Linear<float>::~Linear(pLVar1);
      operator_delete(pLVar1,0x28);
    }
    this->qLinear = (Linear<float> *)0x0;
  }
  if (this->kLinear != (Linear<float> *)0x0) {
    pLVar1 = this->kLinear;
    if (pLVar1 != (Linear<float> *)0x0) {
      Linear<float>::~Linear(pLVar1);
      operator_delete(pLVar1,0x28);
    }
    this->kLinear = (Linear<float> *)0x0;
  }
  if (this->vLinear != (Linear<float> *)0x0) {
    pLVar1 = this->vLinear;
    if (pLVar1 != (Linear<float> *)0x0) {
      Linear<float>::~Linear(pLVar1);
      operator_delete(pLVar1,0x28);
    }
    this->vLinear = (Linear<float> *)0x0;
  }
  if (this->outLinear != (Linear<float> *)0x0) {
    pLVar1 = this->outLinear;
    if (pLVar1 != (Linear<float> *)0x0) {
      Linear<float>::~Linear(pLVar1);
      operator_delete(pLVar1,0x28);
    }
    this->outLinear = (Linear<float> *)0x0;
  }
  if (this->upperLowerMask != (Tensor<float> *)0x0) {
    pTVar2 = this->upperLowerMask;
    if (pTVar2 != (Tensor<float> *)0x0) {
      Tensor<float>::~Tensor(pTVar2);
      operator_delete(pTVar2,0x30);
    }
    this->upperLowerMask = (Tensor<float> *)0x0;
  }
  if (this->leftRightMask != (Tensor<float> *)0x0) {
    pTVar2 = this->leftRightMask;
    if (pTVar2 != (Tensor<float> *)0x0) {
      Tensor<float>::~Tensor(pTVar2);
      operator_delete(pTVar2,0x30);
    }
    this->leftRightMask = (Tensor<float> *)0x0;
  }
  if (this->relativeIndices != (Tensor<int> *)0x0) {
    this_00 = this->relativeIndices;
    if (this_00 != (Tensor<int> *)0x0) {
      Tensor<int>::~Tensor(this_00);
      operator_delete(this_00,0x30);
    }
    this->relativeIndices = (Tensor<int> *)0x0;
  }
  if (this->posEmbedding != (Tensor<float> *)0x0) {
    pTVar2 = this->posEmbedding;
    if (pTVar2 != (Tensor<float> *)0x0) {
      Tensor<float>::~Tensor(pTVar2);
      operator_delete(pTVar2,0x30);
    }
    this->posEmbedding = (Tensor<float> *)0x0;
  }
  if (this->cyclicShift != (CyclicShift<float> *)0x0) {
    if (this->cyclicShift != (CyclicShift<float> *)0x0) {
      operator_delete(this->cyclicShift,0x10);
    }
    this->cyclicShift = (CyclicShift<float> *)0x0;
  }
  if (this->cyclicBackShift != (CyclicShift<float> *)0x0) {
    if (this->cyclicBackShift != (CyclicShift<float> *)0x0) {
      operator_delete(this->cyclicBackShift,0x10);
    }
    this->cyclicBackShift = (CyclicShift<float> *)0x0;
  }
  return;
}

Assistant:

~WindowAttention() {
            if (qLinear != nullptr) {
                delete qLinear;
                qLinear = nullptr;
            }
            if (kLinear != nullptr) {
                delete kLinear;
                kLinear = nullptr;
            }
            if (vLinear != nullptr) {
                delete vLinear;
                vLinear = nullptr;
            }
            if (outLinear != nullptr) {
                delete outLinear;
                outLinear = nullptr;
            }
            if (upperLowerMask != nullptr) {
                delete upperLowerMask;
                upperLowerMask = nullptr;
            }
            if (leftRightMask != nullptr) {
                delete leftRightMask;
                leftRightMask = nullptr;
            }
            if (relativeIndices != nullptr) {
                delete relativeIndices;
                relativeIndices = nullptr;
            }
            if (posEmbedding != nullptr) {
                delete posEmbedding;
                posEmbedding = nullptr;
            }
            if (cyclicShift != nullptr) {
                delete cyclicShift;
                cyclicShift = nullptr;
            }
            if (cyclicBackShift != nullptr) {
                delete cyclicBackShift;
                cyclicBackShift = nullptr;
            }
        }